

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::QuadMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::QuadMesh,_embree::QuadMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  float fVar4;
  undefined4 uVar5;
  BBox1f BVar6;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_> *pvVar7
  ;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar8;
  PrimRefMB *pPVar9;
  MemoryMonitorInterface *pMVar10;
  PrimRefVector pmVar11;
  code *pcVar12;
  ThreadLocal2 *pTVar13;
  NodeRefPtr<4> this_00;
  Scene *pSVar14;
  Geometry *pGVar15;
  float fVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar22;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar23;
  BuildRecord *pBVar24;
  vuint<4> vVar25;
  undefined8 uVar26;
  byte bVar27;
  char cVar28;
  mvector<PrimRefMB> *prims;
  BBox1f BVar29;
  tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  tVar30;
  intrusive_list_node *piVar31;
  size_t sVar32;
  long lVar33;
  undefined8 *puVar34;
  runtime_error *prVar35;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar36;
  float *pfVar37;
  unsigned_long uVar38;
  range<unsigned_long> *prVar39;
  Split *pSVar40;
  ulong uVar41;
  PrimRefMB *pPVar42;
  char *pcVar43;
  int iVar44;
  task_group_context *ptVar45;
  size_t sVar46;
  long lVar47;
  uint uVar48;
  ulong uVar49;
  long lVar50;
  unsigned_long uVar51;
  size_t i_3;
  Split *pSVar52;
  ulong uVar53;
  byte bVar54;
  LocalChildListSplit *in_00;
  int iVar55;
  SetMB *this_01;
  int iVar56;
  size_t i_5;
  BBox1f *pBVar57;
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar88;
  float fVar89;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar90;
  undefined1 auVar87 [16];
  float fVar92;
  float fVar93;
  undefined1 auVar91 [16];
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar102;
  float fVar103;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar104;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 local_1ef8 [16];
  undefined8 uStack_1ef0;
  undefined1 local_1ee8 [16];
  ulong local_1ec8;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1eb8 [16];
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1e78 [16];
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1e48;
  PrimRefVector lprims;
  undefined8 local_1e38;
  float fStack_1e30;
  float fStack_1e2c;
  vuint<4> v2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e08;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aaStack_1df8 [9];
  anon_class_1_0_00000001 reduction;
  undefined1 local_1d48 [12];
  undefined4 uStack_1d3c;
  undefined1 local_1d38 [12];
  undefined4 uStack_1d2c;
  undefined1 local_1d28 [12];
  undefined4 uStack_1d1c;
  undefined1 local_1d18 [12];
  undefined4 uStack_1d0c;
  PrimInfoMB right;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1bf8 [16];
  vuint<4> v0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bd8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bc8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ba8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b98 [2];
  BBox1f local_1b78;
  BBox1f local_1b70;
  BBox1f local_1b50;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1b48;
  BinSplit<32UL> local_1b38;
  undefined1 local_1af8 [16];
  vuint<4> v1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ad8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ac8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ab8 [4];
  BBox1f local_1a78;
  size_t local_1a70;
  BBox1f local_1a50;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1a48;
  BinSplit<32UL> local_1a38;
  anon_class_24_3_c5d13451 isLeft;
  unsigned_long local_1998;
  unsigned_long local_1990;
  vint vSplitPos;
  float local_18e8;
  BuildRecordSplit current;
  NodeRecordMB4D values [16];
  LocalChildListSplit children;
  
  if ((this->cfg).maxDepth < in->depth) {
    puVar34 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&children,"depth limit reached",(allocator *)values);
    *puVar34 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar34 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar34 + 2),(string *)&children);
    __cxa_throw(puVar34,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  children.children.items[0].super_BuildRecord._8_8_ =
       children.children.items[0].super_BuildRecord.depth;
  children.children.items[0].super_BuildRecord.depth = in->depth;
  SetMB::SetMB(&children.children.items[0].super_BuildRecord.prims,&in->prims);
  findFallback((Split *)values,this,&in->prims);
  BuildRecord::BuildRecord(&current.super_BuildRecord,(BuildRecord *)&children);
  auVar61 = values[0]._0_16_;
  current.split.sah = (float)values[0].ref.ptr;
  current.split.dim = (int)values[0].ref.ptr._4_4_;
  current.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)values[0]._8_4_;
  current.split.data = values[0]._12_4_;
  uVar26 = current.split._8_8_;
  current.split.mapping.ofs.field_0._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
  current.split.mapping.scale.field_0._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
  current.split.mapping.scale.field_0._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
  uVar51 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if (current.super_BuildRecord.depth == 1) {
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end ==
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin) {
      bVar54 = 0;
      uVar51 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
    }
    else {
      lVar33 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0x40;
      auVar62 = ZEXT816(0xff8000007f800000);
      for (uVar38 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
          uVar38 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
          uVar38 = uVar38 + 1) {
        auVar73._8_8_ = 0;
        auVar73._0_8_ =
             *(ulong *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                               lower.field_0 + lVar33);
        auVar74 = vcmpps_avx(auVar62,auVar73,1);
        auVar66 = vinsertps_avx(auVar62,auVar73,0x50);
        auVar62 = vblendps_avx(auVar73,auVar62,2);
        auVar62 = vblendvps_avx(auVar62,auVar66,auVar74);
        lVar33 = lVar33 + 0x50;
      }
      auVar74 = vmovshdup_avx(auVar62);
      auVar74 = vcmpps_avx(auVar74,ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.
                                                 time_range.upper),1);
      auVar62 = vcmpps_avx(ZEXT416((uint)current.super_BuildRecord.prims.super_PrimInfoMB.time_range
                                         .lower),auVar62,1);
      auVar62 = vorps_avx(auVar62,auVar74);
      bVar54 = auVar62[0] & 1;
    }
  }
  else {
    bVar54 = 0;
  }
  current.split._8_8_ = uVar26;
  if (((current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar51 <=
        (this->cfg).maxLeafSize) && (current.split.data = auVar61._12_4_, current.split.data < 2))
     && (bVar54 == 0)) {
    uVar53 = (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar51) + 3 >> 2;
    v1.field_0.v[0] = uVar53 * 0x60;
    this_00.ptr = (size_t)(alloc.talloc1)->parent;
    values[0]._0_16_ = auVar61;
    if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p) {
      values[0]._9_7_ = auVar61._9_7_;
      values[0]._8_1_ = 1;
      values[0].ref.ptr = this_00.ptr;
      MutexSys::lock((MutexSys *)this_00.ptr);
      if ((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p != (__pointer_type)0x0
         ) {
        LOCK();
        paVar2 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xa8) + (long)*(void **)(this_00.ptr + 0x68);
        UNLOCK();
        LOCK();
        paVar2 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((long)*(void **)(this_00.ptr + 0x58) + (long)*(void **)(this_00.ptr + 0x98)) -
             ((long)*(void **)(this_00.ptr + 0x50) + (long)*(void **)(this_00.ptr + 0x90)));
        UNLOCK();
        LOCK();
        paVar2 = &((((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p)->bytesWasted
        ;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)(this_00.ptr + 0xb0) + (long)*(void **)(this_00.ptr + 0x70);
        UNLOCK();
      }
      auVar61 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(this_00.ptr + 0x58) = ZEXT1632(auVar61);
      *(undefined1 (*) [32])(this_00.ptr + 0x48) = ZEXT1632(auVar61);
      auVar68 = ZEXT1632(auVar61);
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar68;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar68;
      }
      else {
        *(void **)(this_00.ptr + 0x60) = (void *)(alloc.alloc)->defaultBlockSize;
        *(undefined1 (*) [32])(this_00.ptr + 0x88) = auVar68;
        *(undefined1 (*) [32])(this_00.ptr + 0x98) = auVar68;
        *(void **)(this_00.ptr + 0xa0) = (void *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)(this_00.ptr + 8))->_M_b)._M_p = alloc.alloc;
      UNLOCK();
      v0.field_0.v[0] = this_00.ptr;
      children.children.items[0].super_BuildRecord._8_1_ = 1;
      children.children.items[0].super_BuildRecord.depth =
           (size_t)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&v0);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    }
    uVar26 = v1.field_0.v[0];
    (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + v1.field_0.v[0];
    sVar32 = (alloc.talloc1)->cur;
    uVar49 = (ulong)(-(int)sVar32 & 0x1f);
    uVar41 = sVar32 + v1.field_0.v[0] + uVar49;
    (alloc.talloc1)->cur = uVar41;
    if ((alloc.talloc1)->end < uVar41) {
      (alloc.talloc1)->cur = sVar32;
      uVar49 = (alloc.talloc1)->allocBlockSize;
      if ((ulong)(v1.field_0.v[0] * 4) < uVar49 || v1.field_0.v[0] * 4 - uVar49 == 0) {
        children.children.items[0].super_BuildRecord.depth = uVar49;
        pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
        (alloc.talloc1)->ptr = pcVar43;
        sVar32 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar32;
        (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
        (alloc.talloc1)->cur = uVar26;
        if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar26) {
          (alloc.talloc1)->cur = 0;
          children.children.items[0].super_BuildRecord.depth = (alloc.talloc1)->allocBlockSize;
          pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
          (alloc.talloc1)->ptr = pcVar43;
          sVar32 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar32;
          (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
          (alloc.talloc1)->cur = uVar26;
          if (children.children.items[0].super_BuildRecord.depth < (ulong)uVar26) {
            (alloc.talloc1)->cur = 0;
            pcVar43 = (char *)0x0;
            goto LAB_00ccec86;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar32;
      }
      else {
        pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v1);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar49;
      pcVar43 = (alloc.talloc1)->ptr + (uVar41 - v1.field_0._0_8_);
    }
LAB_00ccec86:
    uVar49 = 7;
    if (uVar53 < 7) {
      uVar49 = uVar53;
    }
    auVar77 = ZEXT1664(ZEXT816(0) << 0x40);
    local_1d18._8_4_ = 0x7f800000;
    local_1d18._0_8_ = 0x7f8000007f800000;
    uStack_1d0c = 0x7f800000;
    local_1d28._8_4_ = 0xff800000;
    local_1d28._0_8_ = 0xff800000ff800000;
    uStack_1d1c = 0xff800000;
    local_1d38._8_4_ = 0x7f800000;
    local_1d38._0_8_ = 0x7f8000007f800000;
    uStack_1d2c = 0x7f800000;
    local_1d48._8_4_ = 0xff800000;
    local_1d48._0_8_ = 0xff800000ff800000;
    uStack_1d3c = 0xff800000;
    for (uVar41 = 0; uVar38 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end,
        uVar41 != uVar53; uVar41 = uVar41 + 1) {
      pPVar9 = (current.super_BuildRecord.prims.prims)->items;
      pSVar14 = ((this->createLeaf).bvh)->scene;
      local_1af8._8_8_ = 0;
      local_1af8._0_8_ =
           CONCAT44(current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper,
                    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower);
      auVar64._8_8_ = 0;
      auVar64._0_8_ =
           CONCAT44(current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper,
                    current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower);
      values[0]._0_16_ = vpcmpeqd_avx(local_1af8,auVar64);
      pPVar42 = pPVar9 + uVar51;
      v0.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
      v1.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
      v2.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)0x0;
      children.children.items[0].super_BuildRecord._0_16_ = values[0]._0_16_;
      for (lVar33 = 0; lVar33 != 0x10; lVar33 = lVar33 + 4) {
        if (uVar51 < uVar38) {
          fVar4 = (pPVar42->lbounds).bounds0.lower.field_0.m128[3];
          *(float *)((long)&children.children.items[0].super_BuildRecord.depth + lVar33) = fVar4;
          fVar16 = (pPVar42->lbounds).bounds0.upper.field_0.m128[3];
          *(float *)((long)&values[0].ref.ptr + lVar33) = fVar16;
          pGVar15 = (pSVar14->geometries).items[(uint)fVar4].ptr;
          lVar50 = (ulong)(uint)fVar16 *
                   pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar47 = *(long *)&pGVar15->field_0x58;
          uVar48 = *(uint *)&pGVar15[1].intersectionFilterN >> 2;
          *(uint *)((long)&v0.field_0 + lVar33) = *(int *)(lVar47 + lVar50) * uVar48;
          *(uint *)((long)&v1.field_0 + lVar33) = *(int *)(lVar47 + 4 + lVar50) * uVar48;
          *(uint *)((long)&v2.field_0 + lVar33) = *(int *)(lVar47 + 8 + lVar50) * uVar48;
          *(uint *)((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                           lower.field_0 + lVar33) = uVar48 * *(int *)(lVar47 + 0xc + lVar50);
          uVar51 = uVar51 + 1;
        }
        else if (lVar33 != 0) {
          *(float *)((long)&children.children.items[0].super_BuildRecord.depth + lVar33) =
               (float)children.children.items[0].super_BuildRecord.depth;
          *(undefined4 *)((long)&values[0].ref.ptr + lVar33) = 0xffffffff;
          uVar5 = v0.field_0.i[0];
          *(uint *)((long)&v0.field_0 + lVar33) = v0.field_0.i[0];
          *(undefined4 *)((long)&v1.field_0 + lVar33) = uVar5;
          *(undefined4 *)((long)&v2.field_0 + lVar33) = uVar5;
          *(undefined4 *)
           ((long)&right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0 + lVar33) = uVar5;
        }
        if (uVar51 < uVar38) {
          pPVar42 = pPVar9 + uVar51;
        }
      }
      lVar33 = uVar41 * 0x60;
      *(longlong *)(pcVar43 + lVar33) = v0.field_0.v[0];
      *(longlong *)((long)(pcVar43 + lVar33) + 8) = v0.field_0.v[1];
      *(longlong *)(pcVar43 + lVar33 + 0x10) = v1.field_0.v[0];
      *(longlong *)((long)(pcVar43 + lVar33 + 0x10) + 8) = v1.field_0.v[1];
      *(longlong *)(pcVar43 + lVar33 + 0x20) = v2.field_0.v[0];
      *(longlong *)((long)(pcVar43 + lVar33 + 0x20) + 8) = v2.field_0.v[1];
      *(undefined8 *)(pcVar43 + lVar33 + 0x30) =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      *(undefined8 *)(pcVar43 + lVar33 + 0x30 + 8) =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _8_8_;
      *(size_t *)(pcVar43 + lVar33 + 0x40) = children.children.items[0].super_BuildRecord.depth;
      *(undefined8 *)((long)(pcVar43 + lVar33 + 0x40) + 8) =
           children.children.items[0].super_BuildRecord._8_8_;
      *(size_t *)(pcVar43 + lVar33 + 0x50) = values[0].ref.ptr;
      *(undefined8 *)((long)(pcVar43 + lVar33 + 0x50) + 8) = values[0]._8_8_;
      auVar74 = vmovshdup_avx(local_1af8);
      auVar69._8_4_ = 0x7f800000;
      auVar69._0_8_ = 0x7f8000007f800000;
      auVar69._12_4_ = 0x7f800000;
      auVar65._8_4_ = 0xff800000;
      auVar65._0_8_ = 0xff800000ff800000;
      auVar65._12_4_ = 0xff800000;
      lVar47 = 0;
      auVar62 = auVar69;
      auVar61 = auVar65;
      while ((lVar47 != 4 &&
             (isLeft.split = (Split *)(ulong)*(uint *)(pcVar43 + lVar47 * 4 + lVar33 + 0x50),
             isLeft.split != (Split *)0xffffffff))) {
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
             = (pSVar14->geometries).items[*(uint *)(pcVar43 + lVar47 * 4 + lVar33 + 0x40)].ptr;
        right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_
             = &isLeft;
        fVar4 = ((Geometry *)
                right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_)->fnumTimeSegments;
        fVar16 = (((Geometry *)
                  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_)->time_range).lower;
        local_1e38._0_4_ =
             (((Geometry *)
              right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
              _0_8_)->time_range).upper - fVar16;
        fVar80 = ((float)local_1af8._0_4_ - fVar16) / (float)local_1e38;
        local_18e8 = auVar74._0_4_;
        local_1e38._0_4_ = (local_18e8 - fVar16) / (float)local_1e38;
        fVar16 = fVar4 * fVar80;
        fVar83 = fVar4 * (float)local_1e38;
        auVar63 = vroundss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),9);
        auVar59 = vroundss_avx(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83),10);
        auVar66 = vmaxss_avx(auVar63,auVar77._0_16_);
        auVar73 = vminss_avx(auVar59,ZEXT416((uint)fVar4));
        iVar44 = (int)auVar66._0_4_;
        fVar97 = auVar73._0_4_;
        iVar55 = (int)auVar63._0_4_;
        iVar56 = -1;
        if (-1 < iVar55) {
          iVar56 = iVar55;
        }
        iVar17 = (int)fVar4 + 1;
        if ((int)auVar59._0_4_ < (int)fVar4 + 1) {
          iVar17 = (int)auVar59._0_4_;
        }
        QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  ((BBox3fa *)&children,(anon_class_16_2_4e716a3c *)&right,(long)iVar44);
        QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                  ((BBox3fa *)values,(anon_class_16_2_4e716a3c *)&right,(long)(int)fVar97);
        fVar16 = fVar16 - auVar66._0_4_;
        if (iVar17 - iVar56 == 1) {
          auVar66 = vmaxss_avx(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40);
          auVar73 = vshufps_avx(auVar66,auVar66,0);
          auVar66 = ZEXT416((uint)(1.0 - auVar66._0_4_));
          auVar66 = vshufps_avx(auVar66,auVar66,0);
          auVar91._0_4_ =
               auVar73._0_4_ * (float)values[0].ref.ptr +
               auVar66._0_4_ * (float)children.children.items[0].super_BuildRecord.depth;
          auVar91._4_4_ =
               auVar73._4_4_ * values[0].ref.ptr._4_4_ +
               auVar66._4_4_ * children.children.items[0].super_BuildRecord.depth._4_4_;
          auVar91._8_4_ =
               auVar73._8_4_ * (float)values[0]._8_4_ +
               auVar66._8_4_ * (float)children.children.items[0].super_BuildRecord._8_4_;
          auVar91._12_4_ =
               auVar73._12_4_ * (float)values[0]._12_4_ +
               auVar66._12_4_ * (float)children.children.items[0].super_BuildRecord._12_4_;
          auVar99._0_4_ =
               auVar73._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               auVar66._0_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [0];
          auVar99._4_4_ =
               auVar73._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               auVar66._4_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [1];
          auVar99._8_4_ =
               auVar73._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               auVar66._8_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [2];
          auVar99._12_4_ =
               auVar73._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               auVar66._12_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [3];
          auVar66 = vmaxss_avx(ZEXT416((uint)(fVar97 - fVar83)),ZEXT816(0) << 0x40);
          auVar73 = vshufps_avx(auVar66,auVar66,0);
          auVar66 = ZEXT416((uint)(1.0 - auVar66._0_4_));
          auVar66 = vshufps_avx(auVar66,auVar66,0);
          auVar81._0_4_ =
               auVar66._0_4_ * (float)values[0].ref.ptr +
               auVar73._0_4_ * (float)children.children.items[0].super_BuildRecord.depth;
          auVar81._4_4_ =
               auVar66._4_4_ * values[0].ref.ptr._4_4_ +
               auVar73._4_4_ * children.children.items[0].super_BuildRecord.depth._4_4_;
          auVar81._8_4_ =
               auVar66._8_4_ * (float)values[0]._8_4_ +
               auVar73._8_4_ * (float)children.children.items[0].super_BuildRecord._8_4_;
          auVar81._12_4_ =
               auVar66._12_4_ * (float)values[0]._12_4_ +
               auVar73._12_4_ * (float)children.children.items[0].super_BuildRecord._12_4_;
          auVar86._0_4_ =
               auVar66._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_ +
               auVar73._0_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [0];
          auVar86._4_4_ =
               auVar66._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_ +
               auVar73._4_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [1];
          auVar86._8_4_ =
               auVar66._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_ +
               auVar73._8_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [2];
          auVar86._12_4_ =
               auVar66._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_ +
               auVar73._12_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [3];
        }
        else {
          QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    ((BBox3fa *)&v0,(anon_class_16_2_4e716a3c *)&right,(long)(iVar44 + 1));
          QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                    ((BBox3fa *)&v1,(anon_class_16_2_4e716a3c *)&right,(long)((int)fVar97 + -1));
          auVar66 = vmaxss_avx(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40);
          auVar73 = vshufps_avx(auVar66,auVar66,0);
          auVar66 = ZEXT416((uint)(1.0 - auVar66._0_4_));
          auVar66 = vshufps_avx(auVar66,auVar66,0);
          auVar91._0_4_ =
               auVar73._0_4_ * (float)v0.field_0.i[0] +
               auVar66._0_4_ * (float)children.children.items[0].super_BuildRecord.depth;
          auVar91._4_4_ =
               auVar73._4_4_ * (float)v0.field_0.i[1] +
               auVar66._4_4_ * children.children.items[0].super_BuildRecord.depth._4_4_;
          auVar91._8_4_ =
               auVar73._8_4_ * (float)v0.field_0.i[2] +
               auVar66._8_4_ * (float)children.children.items[0].super_BuildRecord._8_4_;
          auVar91._12_4_ =
               auVar73._12_4_ * (float)v0.field_0.i[3] +
               auVar66._12_4_ * (float)children.children.items[0].super_BuildRecord._12_4_;
          auVar99._0_4_ =
               auVar73._0_4_ * local_1bd8.m128[0] +
               auVar66._0_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [0];
          auVar99._4_4_ =
               auVar73._4_4_ * local_1bd8.m128[1] +
               auVar66._4_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [1];
          auVar99._8_4_ =
               auVar73._8_4_ * local_1bd8.m128[2] +
               auVar66._8_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [2];
          auVar99._12_4_ =
               auVar73._12_4_ * local_1bd8.m128[3] +
               auVar66._12_4_ *
               children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
               super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128
               [3];
          auVar66 = vmaxss_avx(ZEXT416((uint)(fVar97 - fVar83)),ZEXT816(0) << 0x40);
          auVar73 = vshufps_avx(auVar66,auVar66,0);
          auVar66 = ZEXT416((uint)(1.0 - auVar66._0_4_));
          auVar66 = vshufps_avx(auVar66,auVar66,0);
          auVar81._0_4_ =
               auVar73._0_4_ * (float)v1.field_0.i[0] + auVar66._0_4_ * (float)values[0].ref.ptr;
          auVar81._4_4_ =
               auVar73._4_4_ * (float)v1.field_0.i[1] + auVar66._4_4_ * values[0].ref.ptr._4_4_;
          auVar81._8_4_ =
               auVar73._8_4_ * (float)v1.field_0.i[2] + auVar66._8_4_ * (float)values[0]._8_4_;
          auVar81._12_4_ =
               auVar73._12_4_ * (float)v1.field_0.i[3] + auVar66._12_4_ * (float)values[0]._12_4_;
          auVar86._0_4_ =
               auVar73._0_4_ * local_1ad8.m128[0] +
               auVar66._0_4_ * (float)values[0].lbounds.bounds0.lower.field_0._0_4_;
          auVar86._4_4_ =
               auVar73._4_4_ * local_1ad8.m128[1] +
               auVar66._4_4_ * (float)values[0].lbounds.bounds0.lower.field_0._4_4_;
          auVar86._8_4_ =
               auVar73._8_4_ * local_1ad8.m128[2] +
               auVar66._8_4_ * (float)values[0].lbounds.bounds0.lower.field_0._8_4_;
          auVar86._12_4_ =
               auVar73._12_4_ * local_1ad8.m128[3] +
               auVar66._12_4_ * (float)values[0].lbounds.bounds0.lower.field_0._12_4_;
          if (iVar55 < 0) {
            iVar55 = -1;
          }
          fVar16 = (float)local_1e38 - fVar80;
          sVar32 = (size_t)iVar55;
          while (sVar32 = sVar32 + 1, (long)sVar32 < (long)iVar17) {
            auVar67._0_4_ = ((float)(int)sVar32 / fVar4 - fVar80) / fVar16;
            auVar67._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar66 = vshufps_avx(auVar67,auVar67,0);
            fVar83 = auVar81._4_4_;
            fVar97 = auVar81._8_4_;
            fVar82 = auVar81._12_4_;
            auVar73 = vshufps_avx(ZEXT416((uint)(1.0 - auVar67._0_4_)),
                                  ZEXT416((uint)(1.0 - auVar67._0_4_)),0);
            fVar92 = auVar91._4_4_;
            fVar93 = auVar91._8_4_;
            fVar94 = auVar91._12_4_;
            local_1e38._0_4_ = auVar81._0_4_ * auVar66._0_4_ + auVar91._0_4_ * auVar73._0_4_;
            local_1e38._4_4_ = fVar83 * auVar66._4_4_ + fVar92 * auVar73._4_4_;
            fStack_1e30 = fVar97 * auVar66._8_4_ + fVar93 * auVar73._8_4_;
            fStack_1e2c = fVar82 * auVar66._12_4_ + fVar94 * auVar73._12_4_;
            fVar88 = auVar86._4_4_;
            fVar89 = auVar86._8_4_;
            fVar90 = auVar86._12_4_;
            fVar102 = auVar99._4_4_;
            fVar103 = auVar99._8_4_;
            fVar104 = auVar99._12_4_;
            QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                      ((BBox3fa *)&v2,(anon_class_16_2_4e716a3c *)&right,sVar32);
            auVar19._4_4_ = local_1e38._4_4_;
            auVar19._0_4_ = (float)local_1e38;
            auVar19._8_4_ = fStack_1e30;
            auVar19._12_4_ = fStack_1e2c;
            auVar63 = vsubps_avx((undefined1  [16])v2.field_0,auVar19);
            auVar20._4_4_ = local_1e18.m128[1];
            auVar20._0_4_ = local_1e18.m128[0];
            auVar20._8_4_ = local_1e18.m128[2];
            auVar20._12_4_ = local_1e18.m128[3];
            auVar18._4_4_ = fVar88 * auVar66._4_4_ + fVar102 * auVar73._4_4_;
            auVar18._0_4_ = auVar86._0_4_ * auVar66._0_4_ + auVar99._0_4_ * auVar73._0_4_;
            auVar18._8_4_ = fVar89 * auVar66._8_4_ + fVar103 * auVar73._8_4_;
            auVar18._12_4_ = fVar90 * auVar66._12_4_ + fVar104 * auVar73._12_4_;
            auVar66 = vsubps_avx(auVar20,auVar18);
            auVar73 = vminps_avx(auVar63,ZEXT816(0) << 0x40);
            auVar66 = vmaxps_avx(auVar66,ZEXT816(0) << 0x40);
            auVar91._0_4_ = auVar91._0_4_ + auVar73._0_4_;
            auVar91._4_4_ = fVar92 + auVar73._4_4_;
            auVar91._8_4_ = fVar93 + auVar73._8_4_;
            auVar91._12_4_ = fVar94 + auVar73._12_4_;
            auVar81._0_4_ = auVar81._0_4_ + auVar73._0_4_;
            auVar81._4_4_ = fVar83 + auVar73._4_4_;
            auVar81._8_4_ = fVar97 + auVar73._8_4_;
            auVar81._12_4_ = fVar82 + auVar73._12_4_;
            auVar99._0_4_ = auVar99._0_4_ + auVar66._0_4_;
            auVar99._4_4_ = fVar102 + auVar66._4_4_;
            auVar99._8_4_ = fVar103 + auVar66._8_4_;
            auVar99._12_4_ = fVar104 + auVar66._12_4_;
            auVar86._0_4_ = auVar86._0_4_ + auVar66._0_4_;
            auVar86._4_4_ = fVar88 + auVar66._4_4_;
            auVar86._8_4_ = fVar89 + auVar66._8_4_;
            auVar86._12_4_ = fVar90 + auVar66._12_4_;
          }
        }
        auVar62 = vminps_avx(auVar62,auVar91);
        auVar65 = vmaxps_avx(auVar65,auVar99);
        auVar69 = vminps_avx(auVar69,auVar81);
        auVar61 = vmaxps_avx(auVar61,auVar86);
        lVar47 = lVar47 + 1;
        auVar77 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      _local_1d18 = vminps_avx(_local_1d18,auVar62);
      _local_1d28 = vmaxps_avx(_local_1d28,auVar65);
      _local_1d38 = vminps_avx(_local_1d38,auVar69);
      _local_1d48 = vmaxps_avx(_local_1d48,auVar61);
    }
    (__return_storage_ptr__->ref).ptr = uVar49 | (ulong)pcVar43 | 8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1d18._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         stack0xffffffffffffe2f0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1d28._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         stack0xffffffffffffe2e0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d38._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         stack0xffffffffffffe2d0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1d48._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
         stack0xffffffffffffe2c0;
    BVar29.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    BVar29.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
    __return_storage_ptr__->dt = BVar29;
    return __return_storage_ptr__;
  }
  local_1e38 = &children;
  array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t
            ((array_t<embree::avx::BVHBuilderMSMBlur::BuildRecordSplit,_16UL> *)&children);
  children.numChildren = 1;
  local_1ec8 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecordSplit::operator=((BuildRecordSplit *)&children,&current);
  children.sharedPrimVecs.items[0].prims = current.super_BuildRecord.prims.prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  bVar27 = 0;
  local_1e78._8_4_ = 0x7f800000;
  local_1e78._0_8_ = 0x7f8000007f800000;
  local_1e78._12_4_ = 0x7f800000;
  local_1eb8._8_4_ = 0xff800000;
  local_1eb8._0_8_ = 0xff800000ff800000;
  local_1eb8._12_4_ = 0xff800000;
  do {
    prVar39 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.object_range;
    uVar53 = 0;
    sVar32 = 0xffffffffffffffff;
    for (sVar46 = 0; children.numChildren != sVar46; sVar46 = sVar46 + 1) {
      uVar49 = prVar39->_end - prVar39->_begin;
      if ((((this->cfg).maxLeafSize < uVar49) || (1 < *(uint *)((long)(prVar39 + 4) + 0xc))) ||
         (bVar54 != 0)) {
        if (uVar53 < uVar49) {
          sVar32 = sVar46;
          uVar53 = uVar49;
        }
        bVar54 = 0;
      }
      prVar39 = prVar39 + 0xf;
    }
    if (sVar32 == 0xffffffffffffffff) break;
    v0.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1b38.sah = INFINITY;
    local_1b38.dim = -1;
    local_1b38.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1b38.data = 0;
    v1.field_0.v[0] = current.super_BuildRecord.depth + 1;
    local_1a38.sah = INFINITY;
    local_1a38.dim = -1;
    local_1a38.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1a38.data = 0;
    uVar48 = children.children.items[sVar32].split.data;
    if (3 < uVar48) goto LAB_00ccdad6;
    this_01 = &children.children.items[sVar32].super_BuildRecord.prims;
    switch(uVar48) {
    case 0:
      isLeft.split = &children.children.items[sVar32].split;
      BVar6 = (BBox1f)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                      object_range._begin;
      v2.field_0.i[2] = 0x7f800000;
      v2.field_0.v[0] = 0x7f8000007f800000;
      v2.field_0.i[3] = 0x7f800000;
      local_1e18.m128[0] = -INFINITY;
      local_1e18.m128[1] = -INFINITY;
      local_1e18.m128[2] = -INFINITY;
      local_1e18.m128[3] = -INFINITY;
      local_1e08.i[0] = 0x7f800000;
      local_1e08.i[1] = 0x7f800000;
      local_1e08.i[2] = 0x7f800000;
      local_1e08.i[3] = 0x7f800000;
      aaStack_1df8[0].i[0] = -INFINITY;
      aaStack_1df8[0].i[1] = -INFINITY;
      aaStack_1df8[0].i[2] = -INFINITY;
      aaStack_1df8[0].i[3] = -INFINITY;
      auVar74._8_4_ = 0x3f800000;
      auVar74._0_8_ = 0x3f8000003f800000;
      auVar74._12_4_ = 0x3f800000;
      vmovlps_avx(auVar74);
      sVar46 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[0]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[1]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[2]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0.m128[3]
           = INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[0]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[1]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[2]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.m128[3]
           = -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[0] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[1] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[2] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0.m128[3] =
           INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[0] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[1] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[2] =
           -INFINITY;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0.m128[3] =
           -INFINITY;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.max_time_range.lower = 0.0;
      right._132_8_ = vmovlps_avx(auVar74);
      right.time_range.upper = 0.0;
      vSplitPos.field_0.i[1] = children.children.items[sVar32].split.field_2.pos;
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar33 = (long)(1 << ((byte)children.children.items[sVar32].split.dim & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar33);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar33 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      BVar29 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                 ((children.children.items[sVar32].super_BuildRecord.prims.prims)->
                                  items,(size_t)BVar6,sVar46,(EmptyTy *)local_1bf8,
                                  (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,&right,&isLeft,
                                  &reduction,&reduction2,0x80,0xc00);
      pvVar36 = children.children.items[sVar32].super_BuildRecord.prims.prims;
      pBVar24 = &children.children.items[sVar32].super_BuildRecord;
      uStack_1ef0 = 0;
      local_1ef8._0_4_ = (pBVar24->prims).super_PrimInfoMB.time_range.lower;
      local_1ef8._4_4_ = (pBVar24->prims).super_PrimInfoMB.time_range.upper;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1bd8.field_1,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2);
      auVar59._8_8_ = 0;
      auVar59._0_4_ = local_1b50.lower;
      auVar59._4_4_ = local_1b50.upper;
      auVar62 = vcmpps_avx(auVar59,local_1ef8,1);
      auVar74 = vinsertps_avx(local_1ef8,auVar59,0x50);
      auVar61 = vblendps_avx(auVar59,local_1ef8,2);
      auVar61 = vblendvps_avx(auVar61,auVar74,auVar62);
      local_1b50 = (BBox1f)vmovlps_avx(auVar61);
      pvVar7 = children.children.items[sVar32].super_BuildRecord.prims.prims;
      pBVar24 = &children.children.items[sVar32].super_BuildRecord;
      uStack_1ef0 = 0;
      local_1ef8._0_4_ = (pBVar24->prims).super_PrimInfoMB.time_range.lower;
      local_1ef8._4_4_ = (pBVar24->prims).super_PrimInfoMB.time_range.upper;
      local_1b78 = BVar6;
      local_1b70 = BVar29;
      local_1b48 = pvVar36;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1ad8.field_1,&right);
      auVar60._8_8_ = 0;
      auVar60._0_4_ = local_1a50.lower;
      auVar60._4_4_ = local_1a50.upper;
      auVar62 = vcmpps_avx(auVar60,local_1ef8,1);
      auVar74 = vinsertps_avx(local_1ef8,auVar60,0x50);
      auVar61 = vblendps_avx(auVar60,local_1ef8,2);
      auVar61 = vblendvps_avx(auVar61,auVar74,auVar62);
      local_1a50 = (BBox1f)vmovlps_avx(auVar61);
      local_1a78 = BVar29;
      local_1a70 = sVar46;
      local_1a48 = pvVar7;
      break;
    case 1:
      SetMB::deterministic_order(this_01);
      splitFallback(this,this_01,(SetMB *)&local_1bd8.field_1,(SetMB *)&local_1ad8.field_1);
      break;
    case 2:
      time_range1.lower = children.children.items[sVar32].split.field_2.fpos;
      time_range0.lower =
           children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.time_range.lower
      ;
      time_range1.upper =
           children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper
      ;
      pmVar11 = children.children.items[sVar32].super_BuildRecord.prims.prims;
      time_range0.upper = time_range1.lower;
      tVar30.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar10 = (this->heuristicTemporalSplit).device;
      ((intrusive_list_node *)
      ((long)tVar30.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl + 0x20))->my_prev_node = (intrusive_list_node *)0x0;
      pSVar40 = (Split *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                         object_range._end;
      uVar51 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      *(MemoryMonitorInterface **)
       tVar30.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar10;
      *(undefined1 *)
       &(((atomic<unsigned_int> *)
         ((long)tVar30.
                super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                .
                super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                ._M_head_impl + 8))->super___atomic_base<unsigned_int>)._M_i = 0;
      ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)
      ((long)tVar30.
             super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
             .
             super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
             ._M_head_impl + 0x10))->my_parent = (task_group_context *)0x0;
      *(context_list **)
       ((long)tVar30.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 0x18) = (context_list *)0x0;
      ptVar45 = (task_group_context *)((long)pSVar40 - uVar51);
      pSVar52 = pSVar40;
      if (ptVar45 != (task_group_context *)0x0) {
        uVar53 = (long)ptVar45 * 0x50;
        (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,uVar53,0);
        if (uVar53 < 0x1c00000) {
          piVar31 = (intrusive_list_node *)alignedMalloc(uVar53,0x10);
        }
        else {
          piVar31 = (intrusive_list_node *)
                    os_malloc(uVar53,(bool *)((long)tVar30.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        ((intrusive_list_node *)
        ((long)tVar30.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl + 0x20))->my_prev_node = piVar31;
        ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)
        ((long)tVar30.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl + 0x10))->my_parent = ptVar45;
        *(task_group_context **)
         ((long)tVar30.
                super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                .
                super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                ._M_head_impl + 0x18) = ptVar45;
        pSVar40 = (Split *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._begin;
        pSVar52 = (Split *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._end;
        local_1ef8._0_8_ =
             (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )tVar30.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl;
      }
      vSplitMask.field_0._8_8_ = &time_range0;
      v2.field_0.i[2] = 0x7f800000;
      v2.field_0.v[0] = 0x7f8000007f800000;
      v2.field_0.i[3] = 0x7f800000;
      auVar61._8_4_ = 0x3f800000;
      auVar61._0_8_ = 0x3f8000003f800000;
      auVar61._12_4_ = 0x3f800000;
      uVar53 = vmovlps_avx(auVar61);
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )tVar30.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims = (PrimRefVector)
               tVar30.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      vSplitMask.field_0._0_8_ = pmVar11;
      if ((ulong)((long)pSVar52 - (long)pSVar40) < 0xc00) {
        isLeft.split = pSVar40;
        isLeft.vSplitPos = (vint *)pSVar52;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&right,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar52;
        vSplitPos.field_0.v[1] = (longlong)pSVar40;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&v2,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)local_1ef8._0_8_);
        cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar28 != '\0') {
          prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar35,"task cancelled");
          __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
      }
      uVar51 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end - children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._begin;
      if (right.object_range._end - right.object_range._begin != uVar51) {
        v2.field_0.v[0] = (longlong)&time_range0;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (lprims->items,0,uVar51,0x400,(anon_class_8_1_41ce32a5 *)&v2);
      }
      ptVar45 = (task_group_context *)CONCAT44(time_range0.upper,time_range0.lower);
      uStack_1ef0 = 0;
      local_1ef8._0_8_ =
           (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              )ptVar45;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,&right);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar53 >> 0x20;
      auVar62 = vcmpps_avx(auVar66,local_1ef8,1);
      auVar74 = vinsertps_avx(local_1ef8,auVar66,0x50);
      auVar61 = vblendps_avx(auVar66,local_1ef8,2);
      auVar61 = vblendvps_avx(auVar61,auVar74,auVar62);
      vmovlps_avx(auVar61);
      SetMB::operator=((SetMB *)&local_1bd8.field_1,(SetMB *)&v2);
      uVar51 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      v2.field_0.i[2] = 0x7f800000;
      v2.field_0.v[0] = 0x7f8000007f800000;
      v2.field_0.i[3] = 0x7f800000;
      local_1e18.m128[0] = -INFINITY;
      local_1e18.m128[1] = -INFINITY;
      local_1e18.m128[2] = -INFINITY;
      local_1e18.m128[3] = -INFINITY;
      local_1e08.i[0] = 0x7f800000;
      local_1e08.i[1] = 0x7f800000;
      local_1e08.i[2] = 0x7f800000;
      local_1e08.i[3] = 0x7f800000;
      aaStack_1df8[0].i[0] = -INFINITY;
      aaStack_1df8[0].i[1] = -INFINITY;
      aaStack_1df8[0].i[2] = -INFINITY;
      aaStack_1df8[0].i[3] = -INFINITY;
      auVar62._8_4_ = 0x3f800000;
      auVar62._0_8_ = 0x3f8000003f800000;
      auVar62._12_4_ = 0x3f800000;
      uVar53 = vmovlps_avx(auVar62);
      pcVar12 = (code *)children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                        object_range._end;
      _reduction2 = pmVar11;
      if ((long)pcVar12 - uVar51 < 0xc00) {
        vSplitPos.field_0.v[0] = uVar51;
        vSplitPos.field_0.v[1] = (longlong)pcVar12;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                   (range<unsigned_long> *)&vSplitPos);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
        local_1bf8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1bf8._8_8_ = &reduction2;
        _reduction = pcVar12;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                   (blocked_range<unsigned_long> *)&v2,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1bf8,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,ptVar45);
        cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar28 != '\0') {
          prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar35,"task cancelled");
          __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
      }
      lVar33 = local_1990 - local_1998;
      local_1998 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.
                   object_range._begin;
      local_1990 = lVar33 + local_1998;
      uVar51 = children.children.items[sVar32].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      if (lVar33 != uVar51 - local_1998) {
        v2.field_0.v[0] = (longlong)&time_range1;
        local_1990 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::RecalculatePrimRef<embree::QuadMesh>,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (pmVar11->items,local_1998,uVar51,0x400,
                                (anon_class_8_1_41ce32a6 *)&v2);
      }
      local_1ef8._4_4_ = time_range1.upper;
      local_1ef8._0_4_ = time_range1.lower;
      uStack_1ef0 = 0;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&v2,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar53 >> 0x20;
      auVar62 = vcmpps_avx(auVar63,local_1ef8,1);
      auVar74 = vinsertps_avx(local_1ef8,auVar63,0x50);
      auVar61 = vblendps_avx(auVar63,local_1ef8,2);
      auVar61 = vblendvps_avx(auVar61,auVar74,auVar62);
      vmovlps_avx(auVar61);
      SetMB::operator=((SetMB *)&local_1ad8.field_1,(SetMB *)&v2);
      bVar58 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      goto LAB_00ccdae6;
    case 3:
      SetMB::deterministic_order(this_01);
      splitByGeometry(this,this_01,(SetMB *)&local_1bd8.field_1,(SetMB *)&local_1ad8.field_1);
    }
LAB_00ccdad6:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    bVar58 = false;
LAB_00ccdae6:
    findFallback((Split *)&v2,this,(SetMB *)&local_1bd8.field_1);
    vVar25 = v2;
    local_1b38.sah = (float)v2.field_0._0_4_;
    local_1b38.dim = v2.field_0._4_4_;
    local_1b38.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)v2.field_0._8_4_;
    local_1b38.data = v2.field_0._12_4_;
    local_1b38.mapping.num = CONCAT44(local_1e18.m128[1],local_1e18.m128[0]);
    local_1b38.mapping.ofs.field_0._0_8_ = CONCAT44(local_1e08.i[1],local_1e08.i[0]);
    local_1b38.mapping.ofs.field_0._8_8_ = CONCAT44(local_1e08.i[3],local_1e08.i[2]);
    local_1b38.mapping.scale.field_0._0_8_ = CONCAT44(aaStack_1df8[0].i[1],aaStack_1df8[0].i[0]);
    local_1b38.mapping.scale.field_0._8_8_ = CONCAT44(aaStack_1df8[0].i[3],aaStack_1df8[0].i[2]);
    v2 = vVar25;
    findFallback((Split *)&v2,this,(SetMB *)&local_1ad8.field_1);
    sVar46 = children.numSharedPrimVecs;
    vVar25 = v2;
    local_1a38.sah = (float)v2.field_0._0_4_;
    local_1a38.dim = v2.field_0._4_4_;
    local_1a38.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)v2.field_0._8_4_;
    local_1a38.data = v2.field_0._12_4_;
    local_1a38.mapping.num = CONCAT44(local_1e18.m128[1],local_1e18.m128[0]);
    local_1a38.mapping.ofs.field_0._0_8_ = CONCAT44(local_1e08.i[1],local_1e08.i[0]);
    local_1a38.mapping.ofs.field_0._8_8_ = CONCAT44(local_1e08.i[3],local_1e08.i[2]);
    local_1a38.mapping.scale.field_0._0_8_ = CONCAT44(aaStack_1df8[0].i[1],aaStack_1df8[0].i[0]);
    local_1a38.mapping.scale.field_0._8_8_ = CONCAT44(aaStack_1df8[0].i[3],aaStack_1df8[0].i[2]);
    local_1e48._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar8 = children.primvecs.items[sVar32];
    if (local_1b48 == pSVar8->prims) {
      pSVar8->refCount = pSVar8->refCount + 1;
      pvVar36 = local_1b48;
    }
    else {
      pSVar22 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar23 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar23->prims = local_1b48;
      children.sharedPrimVecs.items[sVar46].refCount = 1;
      children.primvecs.items[sVar32] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar22->prims;
      pvVar36 = pSVar8->prims;
    }
    sVar46 = children.numSharedPrimVecs;
    if (local_1a48 == pvVar36) {
      children.primvecs.items[children.numChildren] = pSVar8;
      sVar46 = pSVar8->refCount;
      pSVar8->refCount = sVar46 + 1;
    }
    else {
      pSVar22 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar23 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar23->prims = local_1a48;
      children.sharedPrimVecs.items[sVar46].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar22->prims;
      sVar46 = pSVar8->refCount - 1;
    }
    pSVar8->refCount = sVar46;
    v2 = vVar25;
    if (sVar46 == 0) {
      pvVar36 = pSVar8->prims;
      if (pvVar36 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar46 = pvVar36->size_alloced;
        pPVar9 = pvVar36->items;
        if (pPVar9 != (PrimRefMB *)0x0) {
          if (sVar46 * 0x50 < 0x1c00000) {
            alignedFree(pPVar9);
          }
          else {
            os_free(pPVar9,sVar46 * 0x50,(pvVar36->alloc).hugepages);
          }
        }
        if (sVar46 != 0) {
          pMVar10 = (pvVar36->alloc).device;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar46 * -0x50,1);
        }
        pvVar36->size_active = 0;
        pvVar36->size_alloced = 0;
        pvVar36->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar36);
    }
    local_1e48._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[sVar32].super_BuildRecord,
               (BuildRecordSplit *)&v0);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[children.numChildren].super_BuildRecord,
               (BuildRecordSplit *)&v1);
    bVar27 = bVar27 | bVar58;
    children.numChildren = children.numChildren + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1e48);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector);
  } while (children.numChildren < (this->cfg).branchingFactor);
  pfVar37 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  sVar32 = children.numChildren;
  while (bVar58 = sVar32 != 0, sVar32 = sVar32 - 1, bVar58) {
    auVar61 = vcmpps_avx(ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.lower),
                         ZEXT416((uint)((BBox1f *)(pfVar37 + -1))->lower),1);
    auVar62 = vcmpps_avx(ZEXT416((uint)*pfVar37),
                         ZEXT416((uint)(in->prims).super_PrimInfoMB.time_range.upper),1);
    auVar61 = vorps_avx(auVar61,auVar62);
    bVar27 = bVar27 | auVar61[0];
    pfVar37 = pfVar37 + 0x3c;
  }
  if ((bVar27 & 1) == 0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0x1c0;
    pTVar13 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
      v1.field_0.v[1]._0_1_ = 1;
      v1.field_0.v[0] = (longlong)pTVar13;
      MutexSys::lock(&pTVar13->mutex);
      if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
             ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar68 = ZEXT1632(ZEXT816(0) << 0x40);
      (pTVar13->alloc0).end = auVar68._0_8_;
      (pTVar13->alloc0).allocBlockSize = auVar68._8_8_;
      (pTVar13->alloc0).bytesUsed = auVar68._16_8_;
      (pTVar13->alloc0).bytesWasted = auVar68._24_8_;
      (pTVar13->alloc0).ptr = (char *)auVar68._0_8_;
      (pTVar13->alloc0).cur = auVar68._8_8_;
      (pTVar13->alloc0).end = auVar68._16_8_;
      (pTVar13->alloc0).allocBlockSize = auVar68._24_8_;
      auVar68 = ZEXT1632(ZEXT816(0) << 0x40);
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar13->alloc1).end = auVar68._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar68._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar68._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar68._24_8_;
        (pTVar13->alloc1).ptr = (char *)auVar68._0_8_;
        (pTVar13->alloc1).cur = auVar68._8_8_;
        (pTVar13->alloc1).end = auVar68._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar68._24_8_;
      }
      else {
        (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar13->alloc1).ptr = (char *)auVar68._0_8_;
        (pTVar13->alloc1).cur = auVar68._8_8_;
        (pTVar13->alloc1).end = auVar68._16_8_;
        (pTVar13->alloc1).allocBlockSize = auVar68._24_8_;
        (pTVar13->alloc1).end = auVar68._0_8_;
        (pTVar13->alloc1).allocBlockSize = auVar68._8_8_;
        (pTVar13->alloc1).bytesUsed = auVar68._16_8_;
        (pTVar13->alloc1).bytesWasted = auVar68._24_8_;
        (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar13->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      v2.field_0.v[0] = (longlong)pTVar13;
      v0.field_0.v[1]._0_1_ = 1;
      v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&v2);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v0);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar32 = (alloc.talloc0)->cur;
    uVar53 = (ulong)(-(int)sVar32 & 0x1f);
    uVar49 = sVar32 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar53;
    (alloc.talloc0)->cur = uVar49;
    if ((alloc.talloc0)->end < uVar49) {
      (alloc.talloc0)->cur = sVar32;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar43;
        sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar32;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
          pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
          (alloc.talloc0)->ptr = pcVar43;
          sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar32;
          (alloc.talloc0)->end = v0.field_0.v[0];
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if ((ulong)v0.field_0.v[0] <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar43 = (char *)0x0;
            goto LAB_00cce854;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar32;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar53;
      pcVar43 = (alloc.talloc0)->ptr +
                (uVar49 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_00cce854:
    pcVar43[0xc0] = '\0';
    pcVar43[0xc1] = '\0';
    pcVar43[0xc2] = -0x80;
    pcVar43[0xc3] = '\x7f';
    pcVar43[0xc4] = '\0';
    pcVar43[0xc5] = '\0';
    pcVar43[0xc6] = -0x80;
    pcVar43[199] = '\x7f';
    pcVar43[200] = '\0';
    pcVar43[0xc9] = '\0';
    pcVar43[0xca] = -0x80;
    pcVar43[0xcb] = '\x7f';
    pcVar43[0xcc] = '\0';
    pcVar43[0xcd] = '\0';
    pcVar43[0xce] = -0x80;
    pcVar43[0xcf] = '\x7f';
    pcVar43[0xd0] = '\0';
    pcVar43[0xd1] = '\0';
    pcVar43[0xd2] = -0x80;
    pcVar43[0xd3] = '\x7f';
    pcVar43[0xd4] = '\0';
    pcVar43[0xd5] = '\0';
    pcVar43[0xd6] = -0x80;
    pcVar43[0xd7] = '\x7f';
    pcVar43[0xd8] = '\0';
    pcVar43[0xd9] = '\0';
    pcVar43[0xda] = -0x80;
    pcVar43[0xdb] = '\x7f';
    pcVar43[0xdc] = '\0';
    pcVar43[0xdd] = '\0';
    pcVar43[0xde] = -0x80;
    pcVar43[0xdf] = '\x7f';
    pcVar43[0x80] = '\0';
    pcVar43[0x81] = '\0';
    pcVar43[0x82] = -0x80;
    pcVar43[0x83] = '\x7f';
    pcVar43[0x84] = '\0';
    pcVar43[0x85] = '\0';
    pcVar43[0x86] = -0x80;
    pcVar43[0x87] = '\x7f';
    pcVar43[0x88] = '\0';
    pcVar43[0x89] = '\0';
    pcVar43[0x8a] = -0x80;
    pcVar43[0x8b] = '\x7f';
    pcVar43[0x8c] = '\0';
    pcVar43[0x8d] = '\0';
    pcVar43[0x8e] = -0x80;
    pcVar43[0x8f] = '\x7f';
    pcVar43[0x90] = '\0';
    pcVar43[0x91] = '\0';
    pcVar43[0x92] = -0x80;
    pcVar43[0x93] = '\x7f';
    pcVar43[0x94] = '\0';
    pcVar43[0x95] = '\0';
    pcVar43[0x96] = -0x80;
    pcVar43[0x97] = '\x7f';
    pcVar43[0x98] = '\0';
    pcVar43[0x99] = '\0';
    pcVar43[0x9a] = -0x80;
    pcVar43[0x9b] = '\x7f';
    pcVar43[0x9c] = '\0';
    pcVar43[0x9d] = '\0';
    pcVar43[0x9e] = -0x80;
    pcVar43[0x9f] = '\x7f';
    pcVar43[0x40] = '\0';
    pcVar43[0x41] = '\0';
    pcVar43[0x42] = -0x80;
    pcVar43[0x43] = '\x7f';
    pcVar43[0x44] = '\0';
    pcVar43[0x45] = '\0';
    pcVar43[0x46] = -0x80;
    pcVar43[0x47] = '\x7f';
    pcVar43[0x48] = '\0';
    pcVar43[0x49] = '\0';
    pcVar43[0x4a] = -0x80;
    pcVar43[0x4b] = '\x7f';
    pcVar43[0x4c] = '\0';
    pcVar43[0x4d] = '\0';
    pcVar43[0x4e] = -0x80;
    pcVar43[0x4f] = '\x7f';
    pcVar43[0x50] = '\0';
    pcVar43[0x51] = '\0';
    pcVar43[0x52] = -0x80;
    pcVar43[0x53] = '\x7f';
    pcVar43[0x54] = '\0';
    pcVar43[0x55] = '\0';
    pcVar43[0x56] = -0x80;
    pcVar43[0x57] = '\x7f';
    pcVar43[0x58] = '\0';
    pcVar43[0x59] = '\0';
    pcVar43[0x5a] = -0x80;
    pcVar43[0x5b] = '\x7f';
    pcVar43[0x5c] = '\0';
    pcVar43[0x5d] = '\0';
    pcVar43[0x5e] = -0x80;
    pcVar43[0x5f] = '\x7f';
    pcVar43[0xe0] = '\0';
    pcVar43[0xe1] = '\0';
    pcVar43[0xe2] = -0x80;
    pcVar43[0xe3] = -1;
    pcVar43[0xe4] = '\0';
    pcVar43[0xe5] = '\0';
    pcVar43[0xe6] = -0x80;
    pcVar43[0xe7] = -1;
    pcVar43[0xe8] = '\0';
    pcVar43[0xe9] = '\0';
    pcVar43[0xea] = -0x80;
    pcVar43[0xeb] = -1;
    pcVar43[0xec] = '\0';
    pcVar43[0xed] = '\0';
    pcVar43[0xee] = -0x80;
    pcVar43[0xef] = -1;
    pcVar43[0xf0] = '\0';
    pcVar43[0xf1] = '\0';
    pcVar43[0xf2] = -0x80;
    pcVar43[0xf3] = -1;
    pcVar43[0xf4] = '\0';
    pcVar43[0xf5] = '\0';
    pcVar43[0xf6] = -0x80;
    pcVar43[0xf7] = -1;
    pcVar43[0xf8] = '\0';
    pcVar43[0xf9] = '\0';
    pcVar43[0xfa] = -0x80;
    pcVar43[0xfb] = -1;
    pcVar43[0xfc] = '\0';
    pcVar43[0xfd] = '\0';
    pcVar43[0xfe] = -0x80;
    pcVar43[0xff] = -1;
    pcVar43[0xa0] = '\0';
    pcVar43[0xa1] = '\0';
    pcVar43[0xa2] = -0x80;
    pcVar43[0xa3] = -1;
    pcVar43[0xa4] = '\0';
    pcVar43[0xa5] = '\0';
    pcVar43[0xa6] = -0x80;
    pcVar43[0xa7] = -1;
    pcVar43[0xa8] = '\0';
    pcVar43[0xa9] = '\0';
    pcVar43[0xaa] = -0x80;
    pcVar43[0xab] = -1;
    pcVar43[0xac] = '\0';
    pcVar43[0xad] = '\0';
    pcVar43[0xae] = -0x80;
    pcVar43[0xaf] = -1;
    pcVar43[0xb0] = '\0';
    pcVar43[0xb1] = '\0';
    pcVar43[0xb2] = -0x80;
    pcVar43[0xb3] = -1;
    pcVar43[0xb4] = '\0';
    pcVar43[0xb5] = '\0';
    pcVar43[0xb6] = -0x80;
    pcVar43[0xb7] = -1;
    pcVar43[0xb8] = '\0';
    pcVar43[0xb9] = '\0';
    pcVar43[0xba] = -0x80;
    pcVar43[0xbb] = -1;
    pcVar43[0xbc] = '\0';
    pcVar43[0xbd] = '\0';
    pcVar43[0xbe] = -0x80;
    pcVar43[0xbf] = -1;
    pcVar43[0x60] = '\0';
    pcVar43[0x61] = '\0';
    pcVar43[0x62] = -0x80;
    pcVar43[99] = -1;
    pcVar43[100] = '\0';
    pcVar43[0x65] = '\0';
    pcVar43[0x66] = -0x80;
    pcVar43[0x67] = -1;
    pcVar43[0x68] = '\0';
    pcVar43[0x69] = '\0';
    pcVar43[0x6a] = -0x80;
    pcVar43[0x6b] = -1;
    pcVar43[0x6c] = '\0';
    pcVar43[0x6d] = '\0';
    pcVar43[0x6e] = -0x80;
    pcVar43[0x6f] = -1;
    pcVar43[0x70] = '\0';
    pcVar43[0x71] = '\0';
    pcVar43[0x72] = -0x80;
    pcVar43[0x73] = -1;
    pcVar43[0x74] = '\0';
    pcVar43[0x75] = '\0';
    pcVar43[0x76] = -0x80;
    pcVar43[0x77] = -1;
    pcVar43[0x78] = '\0';
    pcVar43[0x79] = '\0';
    pcVar43[0x7a] = -0x80;
    pcVar43[0x7b] = -1;
    pcVar43[0x7c] = '\0';
    pcVar43[0x7d] = '\0';
    pcVar43[0x7e] = -0x80;
    pcVar43[0x7f] = -1;
    auVar68 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar43 + 0x100) = auVar68;
    *(undefined1 (*) [32])(pcVar43 + 0x120) = auVar68;
    auVar68 = ZEXT1232(ZEXT812(0)) << 0x20;
    *(undefined1 (*) [32])(pcVar43 + 0x140) = auVar68;
    *(undefined1 (*) [32])(pcVar43 + 0x160) = auVar68;
    *(undefined1 (*) [32])(pcVar43 + 0x180) = auVar68;
    *(undefined1 (*) [32])(pcVar43 + 0x1a0) = auVar68;
    for (lVar33 = 0; lVar33 != 8; lVar33 = lVar33 + 1) {
      pcVar3 = pcVar43 + lVar33 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
    }
    goto LAB_00cce8d9;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x200;
  pTVar13 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar13->alloc)._M_b._M_p) {
    v1.field_0.v[1]._0_1_ = 1;
    v1.field_0.v[0] = (longlong)pTVar13;
    MutexSys::lock(&pTVar13->mutex);
    if ((pTVar13->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesUsed + (pTVar13->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar13->alloc0).end + (pTVar13->alloc1).end) -
           ((pTVar13->alloc0).cur + (pTVar13->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar13->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar13->alloc1).bytesWasted + (pTVar13->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar68 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar13->alloc0).end = auVar68._0_8_;
    (pTVar13->alloc0).allocBlockSize = auVar68._8_8_;
    (pTVar13->alloc0).bytesUsed = auVar68._16_8_;
    (pTVar13->alloc0).bytesWasted = auVar68._24_8_;
    (pTVar13->alloc0).ptr = (char *)auVar68._0_8_;
    (pTVar13->alloc0).cur = auVar68._8_8_;
    (pTVar13->alloc0).end = auVar68._16_8_;
    (pTVar13->alloc0).allocBlockSize = auVar68._24_8_;
    auVar68 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar13->alloc1).end = auVar68._0_8_;
      (pTVar13->alloc1).allocBlockSize = auVar68._8_8_;
      (pTVar13->alloc1).bytesUsed = auVar68._16_8_;
      (pTVar13->alloc1).bytesWasted = auVar68._24_8_;
      (pTVar13->alloc1).ptr = (char *)auVar68._0_8_;
      (pTVar13->alloc1).cur = auVar68._8_8_;
      (pTVar13->alloc1).end = auVar68._16_8_;
      (pTVar13->alloc1).allocBlockSize = auVar68._24_8_;
    }
    else {
      (pTVar13->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar13->alloc1).ptr = (char *)auVar68._0_8_;
      (pTVar13->alloc1).cur = auVar68._8_8_;
      (pTVar13->alloc1).end = auVar68._16_8_;
      (pTVar13->alloc1).allocBlockSize = auVar68._24_8_;
      (pTVar13->alloc1).end = auVar68._0_8_;
      (pTVar13->alloc1).allocBlockSize = auVar68._8_8_;
      (pTVar13->alloc1).bytesUsed = auVar68._16_8_;
      (pTVar13->alloc1).bytesWasted = auVar68._24_8_;
      (pTVar13->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar13->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v2.field_0.v[0] = (longlong)pTVar13;
    v0.field_0.v[1]._0_1_ = 1;
    v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&v2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar32 = (alloc.talloc0)->cur;
  uVar53 = (ulong)(-(int)sVar32 & 0x1f);
  uVar49 = sVar32 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar53;
  (alloc.talloc0)->cur = uVar49;
  if ((alloc.talloc0)->end < uVar49) {
    (alloc.talloc0)->cur = sVar32;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
      pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
      (alloc.talloc0)->ptr = pcVar43;
      sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar32;
      (alloc.talloc0)->end = v0.field_0.v[0];
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if ((ulong)v0.field_0.v[0] <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        v0.field_0.v[0] = (alloc.talloc0)->allocBlockSize;
        pcVar43 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc0)->ptr = pcVar43;
        sVar32 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar32;
        (alloc.talloc0)->end = v0.field_0.v[0];
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if ((ulong)v0.field_0.v[0] <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar43 = (char *)0x0;
          goto LAB_00cce710;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar32;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar53;
    pcVar43 = (alloc.talloc0)->ptr +
              (uVar49 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_00cce710:
  pcVar43[0x1c0] = '\0';
  pcVar43[0x1c1] = '\0';
  pcVar43[0x1c2] = -0x80;
  pcVar43[0x1c3] = '\x7f';
  pcVar43[0x1c4] = '\0';
  pcVar43[0x1c5] = '\0';
  pcVar43[0x1c6] = -0x80;
  pcVar43[0x1c7] = '\x7f';
  pcVar43[0x1c8] = '\0';
  pcVar43[0x1c9] = '\0';
  pcVar43[0x1ca] = -0x80;
  pcVar43[0x1cb] = '\x7f';
  pcVar43[0x1cc] = '\0';
  pcVar43[0x1cd] = '\0';
  pcVar43[0x1ce] = -0x80;
  pcVar43[0x1cf] = '\x7f';
  pcVar43[0x1d0] = '\0';
  pcVar43[0x1d1] = '\0';
  pcVar43[0x1d2] = -0x80;
  pcVar43[0x1d3] = '\x7f';
  pcVar43[0x1d4] = '\0';
  pcVar43[0x1d5] = '\0';
  pcVar43[0x1d6] = -0x80;
  pcVar43[0x1d7] = '\x7f';
  pcVar43[0x1d8] = '\0';
  pcVar43[0x1d9] = '\0';
  pcVar43[0x1da] = -0x80;
  pcVar43[0x1db] = '\x7f';
  pcVar43[0x1dc] = '\0';
  pcVar43[0x1dd] = '\0';
  pcVar43[0x1de] = -0x80;
  pcVar43[0x1df] = '\x7f';
  pcVar43[0x1e0] = '\0';
  pcVar43[0x1e1] = '\0';
  pcVar43[0x1e2] = -0x80;
  pcVar43[0x1e3] = -1;
  pcVar43[0x1e4] = '\0';
  pcVar43[0x1e5] = '\0';
  pcVar43[0x1e6] = -0x80;
  pcVar43[0x1e7] = -1;
  pcVar43[0x1e8] = '\0';
  pcVar43[0x1e9] = '\0';
  pcVar43[0x1ea] = -0x80;
  pcVar43[0x1eb] = -1;
  pcVar43[0x1ec] = '\0';
  pcVar43[0x1ed] = '\0';
  pcVar43[0x1ee] = -0x80;
  pcVar43[0x1ef] = -1;
  pcVar43[0x1f0] = '\0';
  pcVar43[0x1f1] = '\0';
  pcVar43[0x1f2] = -0x80;
  pcVar43[499] = -1;
  pcVar43[500] = '\0';
  pcVar43[0x1f5] = '\0';
  pcVar43[0x1f6] = -0x80;
  pcVar43[0x1f7] = -1;
  pcVar43[0x1f8] = '\0';
  pcVar43[0x1f9] = '\0';
  pcVar43[0x1fa] = -0x80;
  pcVar43[0x1fb] = -1;
  pcVar43[0x1fc] = '\0';
  pcVar43[0x1fd] = '\0';
  pcVar43[0x1fe] = -0x80;
  pcVar43[0x1ff] = -1;
  pcVar43[0xc0] = '\0';
  pcVar43[0xc1] = '\0';
  pcVar43[0xc2] = -0x80;
  pcVar43[0xc3] = '\x7f';
  pcVar43[0xc4] = '\0';
  pcVar43[0xc5] = '\0';
  pcVar43[0xc6] = -0x80;
  pcVar43[199] = '\x7f';
  pcVar43[200] = '\0';
  pcVar43[0xc9] = '\0';
  pcVar43[0xca] = -0x80;
  pcVar43[0xcb] = '\x7f';
  pcVar43[0xcc] = '\0';
  pcVar43[0xcd] = '\0';
  pcVar43[0xce] = -0x80;
  pcVar43[0xcf] = '\x7f';
  pcVar43[0xd0] = '\0';
  pcVar43[0xd1] = '\0';
  pcVar43[0xd2] = -0x80;
  pcVar43[0xd3] = '\x7f';
  pcVar43[0xd4] = '\0';
  pcVar43[0xd5] = '\0';
  pcVar43[0xd6] = -0x80;
  pcVar43[0xd7] = '\x7f';
  pcVar43[0xd8] = '\0';
  pcVar43[0xd9] = '\0';
  pcVar43[0xda] = -0x80;
  pcVar43[0xdb] = '\x7f';
  pcVar43[0xdc] = '\0';
  pcVar43[0xdd] = '\0';
  pcVar43[0xde] = -0x80;
  pcVar43[0xdf] = '\x7f';
  pcVar43[0x80] = '\0';
  pcVar43[0x81] = '\0';
  pcVar43[0x82] = -0x80;
  pcVar43[0x83] = '\x7f';
  pcVar43[0x84] = '\0';
  pcVar43[0x85] = '\0';
  pcVar43[0x86] = -0x80;
  pcVar43[0x87] = '\x7f';
  pcVar43[0x88] = '\0';
  pcVar43[0x89] = '\0';
  pcVar43[0x8a] = -0x80;
  pcVar43[0x8b] = '\x7f';
  pcVar43[0x8c] = '\0';
  pcVar43[0x8d] = '\0';
  pcVar43[0x8e] = -0x80;
  pcVar43[0x8f] = '\x7f';
  pcVar43[0x90] = '\0';
  pcVar43[0x91] = '\0';
  pcVar43[0x92] = -0x80;
  pcVar43[0x93] = '\x7f';
  pcVar43[0x94] = '\0';
  pcVar43[0x95] = '\0';
  pcVar43[0x96] = -0x80;
  pcVar43[0x97] = '\x7f';
  pcVar43[0x98] = '\0';
  pcVar43[0x99] = '\0';
  pcVar43[0x9a] = -0x80;
  pcVar43[0x9b] = '\x7f';
  pcVar43[0x9c] = '\0';
  pcVar43[0x9d] = '\0';
  pcVar43[0x9e] = -0x80;
  pcVar43[0x9f] = '\x7f';
  pcVar43[0x40] = '\0';
  pcVar43[0x41] = '\0';
  pcVar43[0x42] = -0x80;
  pcVar43[0x43] = '\x7f';
  pcVar43[0x44] = '\0';
  pcVar43[0x45] = '\0';
  pcVar43[0x46] = -0x80;
  pcVar43[0x47] = '\x7f';
  pcVar43[0x48] = '\0';
  pcVar43[0x49] = '\0';
  pcVar43[0x4a] = -0x80;
  pcVar43[0x4b] = '\x7f';
  pcVar43[0x4c] = '\0';
  pcVar43[0x4d] = '\0';
  pcVar43[0x4e] = -0x80;
  pcVar43[0x4f] = '\x7f';
  pcVar43[0x50] = '\0';
  pcVar43[0x51] = '\0';
  pcVar43[0x52] = -0x80;
  pcVar43[0x53] = '\x7f';
  pcVar43[0x54] = '\0';
  pcVar43[0x55] = '\0';
  pcVar43[0x56] = -0x80;
  pcVar43[0x57] = '\x7f';
  pcVar43[0x58] = '\0';
  pcVar43[0x59] = '\0';
  pcVar43[0x5a] = -0x80;
  pcVar43[0x5b] = '\x7f';
  pcVar43[0x5c] = '\0';
  pcVar43[0x5d] = '\0';
  pcVar43[0x5e] = -0x80;
  pcVar43[0x5f] = '\x7f';
  pcVar43[0xe0] = '\0';
  pcVar43[0xe1] = '\0';
  pcVar43[0xe2] = -0x80;
  pcVar43[0xe3] = -1;
  pcVar43[0xe4] = '\0';
  pcVar43[0xe5] = '\0';
  pcVar43[0xe6] = -0x80;
  pcVar43[0xe7] = -1;
  pcVar43[0xe8] = '\0';
  pcVar43[0xe9] = '\0';
  pcVar43[0xea] = -0x80;
  pcVar43[0xeb] = -1;
  pcVar43[0xec] = '\0';
  pcVar43[0xed] = '\0';
  pcVar43[0xee] = -0x80;
  pcVar43[0xef] = -1;
  pcVar43[0xf0] = '\0';
  pcVar43[0xf1] = '\0';
  pcVar43[0xf2] = -0x80;
  pcVar43[0xf3] = -1;
  pcVar43[0xf4] = '\0';
  pcVar43[0xf5] = '\0';
  pcVar43[0xf6] = -0x80;
  pcVar43[0xf7] = -1;
  pcVar43[0xf8] = '\0';
  pcVar43[0xf9] = '\0';
  pcVar43[0xfa] = -0x80;
  pcVar43[0xfb] = -1;
  pcVar43[0xfc] = '\0';
  pcVar43[0xfd] = '\0';
  pcVar43[0xfe] = -0x80;
  pcVar43[0xff] = -1;
  pcVar43[0xa0] = '\0';
  pcVar43[0xa1] = '\0';
  pcVar43[0xa2] = -0x80;
  pcVar43[0xa3] = -1;
  pcVar43[0xa4] = '\0';
  pcVar43[0xa5] = '\0';
  pcVar43[0xa6] = -0x80;
  pcVar43[0xa7] = -1;
  pcVar43[0xa8] = '\0';
  pcVar43[0xa9] = '\0';
  pcVar43[0xaa] = -0x80;
  pcVar43[0xab] = -1;
  pcVar43[0xac] = '\0';
  pcVar43[0xad] = '\0';
  pcVar43[0xae] = -0x80;
  pcVar43[0xaf] = -1;
  pcVar43[0xb0] = '\0';
  pcVar43[0xb1] = '\0';
  pcVar43[0xb2] = -0x80;
  pcVar43[0xb3] = -1;
  pcVar43[0xb4] = '\0';
  pcVar43[0xb5] = '\0';
  pcVar43[0xb6] = -0x80;
  pcVar43[0xb7] = -1;
  pcVar43[0xb8] = '\0';
  pcVar43[0xb9] = '\0';
  pcVar43[0xba] = -0x80;
  pcVar43[0xbb] = -1;
  pcVar43[0xbc] = '\0';
  pcVar43[0xbd] = '\0';
  pcVar43[0xbe] = -0x80;
  pcVar43[0xbf] = -1;
  pcVar43[0x60] = '\0';
  pcVar43[0x61] = '\0';
  pcVar43[0x62] = -0x80;
  pcVar43[99] = -1;
  pcVar43[100] = '\0';
  pcVar43[0x65] = '\0';
  pcVar43[0x66] = -0x80;
  pcVar43[0x67] = -1;
  pcVar43[0x68] = '\0';
  pcVar43[0x69] = '\0';
  pcVar43[0x6a] = -0x80;
  pcVar43[0x6b] = -1;
  pcVar43[0x6c] = '\0';
  pcVar43[0x6d] = '\0';
  pcVar43[0x6e] = -0x80;
  pcVar43[0x6f] = -1;
  pcVar43[0x70] = '\0';
  pcVar43[0x71] = '\0';
  pcVar43[0x72] = -0x80;
  pcVar43[0x73] = -1;
  pcVar43[0x74] = '\0';
  pcVar43[0x75] = '\0';
  pcVar43[0x76] = -0x80;
  pcVar43[0x77] = -1;
  pcVar43[0x78] = '\0';
  pcVar43[0x79] = '\0';
  pcVar43[0x7a] = -0x80;
  pcVar43[0x7b] = -1;
  pcVar43[0x7c] = '\0';
  pcVar43[0x7d] = '\0';
  pcVar43[0x7e] = -0x80;
  pcVar43[0x7f] = -1;
  auVar68 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar43 + 0x100) = auVar68;
  *(undefined1 (*) [32])(pcVar43 + 0x120) = auVar68;
  auVar68 = ZEXT1232(ZEXT812(0)) << 0x20;
  *(undefined1 (*) [32])(pcVar43 + 0x140) = auVar68;
  *(undefined1 (*) [32])(pcVar43 + 0x160) = auVar68;
  *(undefined1 (*) [32])(pcVar43 + 0x180) = auVar68;
  *(undefined1 (*) [32])(pcVar43 + 0x1a0) = auVar68;
  local_1ec8 = 6;
  for (lVar33 = 0; lVar33 != 8; lVar33 = lVar33 + 1) {
    pcVar3 = pcVar43 + lVar33 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
LAB_00cce8d9:
  local_1ec8 = local_1ec8 | (ulong)pcVar43;
  pBVar57 = &values[0].dt;
  local_1ee8._8_4_ = 0xff800000;
  local_1ee8._0_8_ = 0xff800000ff800000;
  local_1ee8._12_4_ = 0xff800000;
  uStack_1ef0._0_4_ = 0x7f800000;
  local_1ef8._0_8_ =
       (tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
        )(_Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
          )0x7f8000007f800000;
  uStack_1ef0._4_4_ = 0x7f800000;
  in_00 = local_1e38;
  for (uVar53 = 0; local_1e38 = in_00, uVar53 < children.numChildren; uVar53 = uVar53 + 1) {
    createLargeLeaf((NodeRecordMB4D *)&v0,this,(BuildRecord *)in_00,alloc);
    vVar25 = v0;
    pBVar57[-10].lower = (float)v0.field_0.v[0]._0_4_;
    pBVar57[-10].upper = (float)v0.field_0._4_4_;
    auVar21._4_4_ = local_1bd8.m128[1];
    auVar21._0_4_ = local_1bd8.m128[0];
    auVar21._8_4_ = local_1bd8.m128[2];
    auVar21._12_4_ = local_1bd8.m128[3];
    *(undefined1 (*) [16])(pBVar57 + -8) = auVar21;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar57 + -6) = local_1bc8;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar57 + -4) = local_1bb8;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar57 + -2) = local_1ba8;
    pBVar57->lower = (float)local_1b98[0]._0_4_;
    pBVar57->upper = (float)local_1b98[0]._4_4_;
    local_1ef8 = vminps_avx(local_1ef8,auVar21);
    local_1ee8 = vmaxps_avx(local_1ee8,(undefined1  [16])local_1bc8);
    local_1e78 = vminps_avx(local_1e78,(undefined1  [16])local_1bb8);
    local_1eb8 = vmaxps_avx(local_1eb8,(undefined1  [16])local_1ba8);
    in_00 = (LocalChildListSplit *)((in_00->children).items + 1);
    pBVar57 = pBVar57 + 0xc;
    v0 = vVar25;
  }
  uVar53 = (ulong)pcVar43 & 0xfffffffffffffff0;
  if (((uint)local_1ec8 & 0xf) == 1) {
    pfVar37 = &values[0].dt.upper;
    auVar71._8_4_ = 0x7f7fffff;
    auVar71._0_8_ = 0x7f7fffff7f7fffff;
    auVar71._12_4_ = 0x7f7fffff;
    auVar75._8_4_ = 0xff7fffff;
    auVar75._0_8_ = 0xff7fffffff7fffff;
    auVar75._12_4_ = 0xff7fffff;
    auVar78._8_4_ = 0x7fffffff;
    auVar78._0_8_ = 0x7fffffff7fffffff;
    auVar78._12_4_ = 0x7fffffff;
    for (sVar32 = 0; children.numChildren != sVar32; sVar32 = sVar32 + 1) {
      *(undefined8 *)(uVar53 + sVar32 * 8) = *(undefined8 *)(pfVar37 + -0x15);
      fVar4 = ((BBox1f *)(pfVar37 + -1))->lower;
      fVar83 = 1.0 / (*pfVar37 - fVar4);
      fVar16 = -fVar4 * fVar83;
      auVar61 = vshufps_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),0);
      auVar62 = vshufps_avx(ZEXT416((uint)(1.0 - fVar16)),ZEXT416((uint)(1.0 - fVar16)),0);
      auVar112._0_4_ = pfVar37[-9] * auVar61._0_4_ + pfVar37[-0x11] * auVar62._0_4_;
      auVar112._4_4_ = pfVar37[-8] * auVar61._4_4_ + pfVar37[-0x10] * auVar62._4_4_;
      auVar112._8_4_ = pfVar37[-7] * auVar61._8_4_ + pfVar37[-0xf] * auVar62._8_4_;
      auVar112._12_4_ = pfVar37[-6] * auVar61._12_4_ + pfVar37[-0xe] * auVar62._12_4_;
      auVar95._0_4_ = pfVar37[-5] * auVar61._0_4_ + pfVar37[-0xd] * auVar62._0_4_;
      auVar95._4_4_ = pfVar37[-4] * auVar61._4_4_ + pfVar37[-0xc] * auVar62._4_4_;
      auVar95._8_4_ = pfVar37[-3] * auVar61._8_4_ + pfVar37[-0xb] * auVar62._8_4_;
      auVar95._12_4_ = pfVar37[-2] * auVar61._12_4_ + pfVar37[-10] * auVar62._12_4_;
      fVar83 = (1.0 - fVar4) * fVar83;
      auVar61 = vshufps_avx(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83),0);
      auVar62 = vshufps_avx(ZEXT416((uint)(1.0 - fVar83)),ZEXT416((uint)(1.0 - fVar83)),0);
      auVar98._0_4_ = pfVar37[-9] * auVar61._0_4_ + pfVar37[-0x11] * auVar62._0_4_;
      auVar98._4_4_ = pfVar37[-8] * auVar61._4_4_ + pfVar37[-0x10] * auVar62._4_4_;
      auVar98._8_4_ = pfVar37[-7] * auVar61._8_4_ + pfVar37[-0xf] * auVar62._8_4_;
      auVar98._12_4_ = pfVar37[-6] * auVar61._12_4_ + pfVar37[-0xe] * auVar62._12_4_;
      auVar84._0_4_ = pfVar37[-5] * auVar61._0_4_ + pfVar37[-0xd] * auVar62._0_4_;
      auVar84._4_4_ = pfVar37[-4] * auVar61._4_4_ + pfVar37[-0xc] * auVar62._4_4_;
      auVar84._8_4_ = pfVar37[-3] * auVar61._8_4_ + pfVar37[-0xb] * auVar62._8_4_;
      auVar84._12_4_ = pfVar37[-2] * auVar61._12_4_ + pfVar37[-10] * auVar62._12_4_;
      auVar66 = vminps_avx(auVar112,auVar71);
      auVar62 = vmaxps_avx(auVar95,auVar75);
      auVar73 = vminps_avx(auVar98,auVar71);
      auVar74 = vmaxps_avx(auVar84,auVar75);
      auVar61 = vandps_avx(auVar66,auVar78);
      auVar105._0_4_ = auVar61._0_4_ * 4.7683716e-07;
      auVar105._4_4_ = auVar61._4_4_ * 4.7683716e-07;
      auVar105._8_4_ = auVar61._8_4_ * 4.7683716e-07;
      auVar105._12_4_ = auVar61._12_4_ * 4.7683716e-07;
      auVar66 = vsubps_avx(auVar66,auVar105);
      auVar61 = vandps_avx(auVar62,auVar78);
      auVar96._0_4_ = auVar62._0_4_ + auVar61._0_4_ * 4.7683716e-07;
      auVar96._4_4_ = auVar62._4_4_ + auVar61._4_4_ * 4.7683716e-07;
      auVar96._8_4_ = auVar62._8_4_ + auVar61._8_4_ * 4.7683716e-07;
      auVar96._12_4_ = auVar62._12_4_ + auVar61._12_4_ * 4.7683716e-07;
      auVar61 = vandps_avx(auVar73,auVar78);
      auVar106._0_4_ = auVar61._0_4_ * 4.7683716e-07;
      auVar106._4_4_ = auVar61._4_4_ * 4.7683716e-07;
      auVar106._8_4_ = auVar61._8_4_ * 4.7683716e-07;
      auVar106._12_4_ = auVar61._12_4_ * 4.7683716e-07;
      auVar62 = vsubps_avx(auVar73,auVar106);
      auVar61 = vandps_avx(auVar74,auVar78);
      *(int *)(uVar53 + 0x40 + sVar32 * 4) = auVar66._0_4_;
      uVar5 = vextractps_avx(auVar66,1);
      *(undefined4 *)(uVar53 + 0x80 + sVar32 * 4) = uVar5;
      auVar85._0_4_ = auVar61._0_4_ * 4.7683716e-07 + auVar74._0_4_;
      auVar85._4_4_ = auVar61._4_4_ * 4.7683716e-07 + auVar74._4_4_;
      auVar85._8_4_ = auVar61._8_4_ * 4.7683716e-07 + auVar74._8_4_;
      auVar85._12_4_ = auVar61._12_4_ * 4.7683716e-07 + auVar74._12_4_;
      uVar5 = vextractps_avx(auVar66,2);
      *(undefined4 *)(uVar53 + 0xc0 + sVar32 * 4) = uVar5;
      *(float *)(uVar53 + 0x60 + sVar32 * 4) = auVar96._0_4_;
      uVar5 = vextractps_avx(auVar96,1);
      *(undefined4 *)(uVar53 + 0xa0 + sVar32 * 4) = uVar5;
      auVar61 = vsubps_avx(auVar62,auVar66);
      uVar5 = vextractps_avx(auVar96,2);
      *(undefined4 *)(uVar53 + 0xe0 + sVar32 * 4) = uVar5;
      *(int *)(uVar53 + 0x100 + sVar32 * 4) = auVar61._0_4_;
      uVar5 = vextractps_avx(auVar61,1);
      *(undefined4 *)(uVar53 + 0x140 + sVar32 * 4) = uVar5;
      auVar62 = vsubps_avx(auVar85,auVar96);
      uVar5 = vextractps_avx(auVar61,2);
      *(undefined4 *)(uVar53 + 0x180 + sVar32 * 4) = uVar5;
      *(int *)(uVar53 + 0x120 + sVar32 * 4) = auVar62._0_4_;
      uVar5 = vextractps_avx(auVar62,1);
      *(undefined4 *)(uVar53 + 0x160 + sVar32 * 4) = uVar5;
      uVar5 = vextractps_avx(auVar62,2);
      *(undefined4 *)(uVar53 + 0x1a0 + sVar32 * 4) = uVar5;
      pfVar37 = pfVar37 + 0x18;
    }
  }
  else {
    pfVar37 = &values[0].dt.upper;
    auVar72._8_4_ = 0x7f7fffff;
    auVar72._0_8_ = 0x7f7fffff7f7fffff;
    auVar72._12_4_ = 0x7f7fffff;
    auVar76._8_4_ = 0xff7fffff;
    auVar76._0_8_ = 0xff7fffffff7fffff;
    auVar76._12_4_ = 0xff7fffff;
    auVar79._8_4_ = 0x7fffffff;
    auVar79._0_8_ = 0x7fffffff7fffffff;
    auVar79._12_4_ = 0x7fffffff;
    auVar87._8_4_ = 0x3f800001;
    auVar87._0_8_ = 0x3f8000013f800001;
    auVar87._12_4_ = 0x3f800001;
    for (sVar32 = 0; children.numChildren != sVar32; sVar32 = sVar32 + 1) {
      *(undefined8 *)(uVar53 + sVar32 * 8) = *(undefined8 *)(pfVar37 + -0x15);
      fVar4 = *pfVar37;
      fVar16 = ((BBox1f *)(pfVar37 + -1))->lower;
      fVar97 = 1.0 / (fVar4 - fVar16);
      fVar83 = fVar97 * -fVar16;
      auVar61 = vshufps_avx(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83),0);
      auVar62 = vshufps_avx(ZEXT416((uint)(1.0 - fVar83)),ZEXT416((uint)(1.0 - fVar83)),0);
      auVar70._0_4_ = pfVar37[-9] * auVar61._0_4_ + pfVar37[-0x11] * auVar62._0_4_;
      auVar70._4_4_ = pfVar37[-8] * auVar61._4_4_ + pfVar37[-0x10] * auVar62._4_4_;
      auVar70._8_4_ = pfVar37[-7] * auVar61._8_4_ + pfVar37[-0xf] * auVar62._8_4_;
      auVar70._12_4_ = pfVar37[-6] * auVar61._12_4_ + pfVar37[-0xe] * auVar62._12_4_;
      auVar107._0_4_ = pfVar37[-5] * auVar61._0_4_ + pfVar37[-0xd] * auVar62._0_4_;
      auVar107._4_4_ = pfVar37[-4] * auVar61._4_4_ + pfVar37[-0xc] * auVar62._4_4_;
      auVar107._8_4_ = pfVar37[-3] * auVar61._8_4_ + pfVar37[-0xb] * auVar62._8_4_;
      auVar107._12_4_ = pfVar37[-2] * auVar61._12_4_ + pfVar37[-10] * auVar62._12_4_;
      fVar97 = (1.0 - fVar16) * fVar97;
      auVar61 = vshufps_avx(ZEXT416((uint)fVar97),ZEXT416((uint)fVar97),0);
      auVar62 = vshufps_avx(ZEXT416((uint)(1.0 - fVar97)),ZEXT416((uint)(1.0 - fVar97)),0);
      auVar109._0_4_ = pfVar37[-9] * auVar61._0_4_ + pfVar37[-0x11] * auVar62._0_4_;
      auVar109._4_4_ = pfVar37[-8] * auVar61._4_4_ + pfVar37[-0x10] * auVar62._4_4_;
      auVar109._8_4_ = pfVar37[-7] * auVar61._8_4_ + pfVar37[-0xf] * auVar62._8_4_;
      auVar109._12_4_ = pfVar37[-6] * auVar61._12_4_ + pfVar37[-0xe] * auVar62._12_4_;
      auVar100._0_4_ = pfVar37[-5] * auVar61._0_4_ + pfVar37[-0xd] * auVar62._0_4_;
      auVar100._4_4_ = pfVar37[-4] * auVar61._4_4_ + pfVar37[-0xc] * auVar62._4_4_;
      auVar100._8_4_ = pfVar37[-3] * auVar61._8_4_ + pfVar37[-0xb] * auVar62._8_4_;
      auVar100._12_4_ = pfVar37[-2] * auVar61._12_4_ + pfVar37[-10] * auVar62._12_4_;
      auVar66 = vminps_avx(auVar70,auVar72);
      auVar62 = vmaxps_avx(auVar107,auVar76);
      auVar73 = vminps_avx(auVar109,auVar72);
      auVar74 = vmaxps_avx(auVar100,auVar76);
      auVar61 = vandps_avx(auVar66,auVar79);
      auVar110._0_4_ = auVar61._0_4_ * 4.7683716e-07;
      auVar110._4_4_ = auVar61._4_4_ * 4.7683716e-07;
      auVar110._8_4_ = auVar61._8_4_ * 4.7683716e-07;
      auVar110._12_4_ = auVar61._12_4_ * 4.7683716e-07;
      auVar66 = vsubps_avx(auVar66,auVar110);
      auVar61 = vandps_avx(auVar62,auVar79);
      auVar108._0_4_ = auVar62._0_4_ + auVar61._0_4_ * 4.7683716e-07;
      auVar108._4_4_ = auVar62._4_4_ + auVar61._4_4_ * 4.7683716e-07;
      auVar108._8_4_ = auVar62._8_4_ + auVar61._8_4_ * 4.7683716e-07;
      auVar108._12_4_ = auVar62._12_4_ + auVar61._12_4_ * 4.7683716e-07;
      auVar61 = vandps_avx(auVar73,auVar79);
      auVar111._0_4_ = auVar61._0_4_ * 4.7683716e-07;
      auVar111._4_4_ = auVar61._4_4_ * 4.7683716e-07;
      auVar111._8_4_ = auVar61._8_4_ * 4.7683716e-07;
      auVar111._12_4_ = auVar61._12_4_ * 4.7683716e-07;
      auVar62 = vsubps_avx(auVar73,auVar111);
      auVar61 = vandps_avx(auVar74,auVar79);
      *(int *)(uVar53 + 0x40 + sVar32 * 4) = auVar66._0_4_;
      uVar5 = vextractps_avx(auVar66,1);
      *(undefined4 *)(uVar53 + 0x80 + sVar32 * 4) = uVar5;
      auVar101._0_4_ = auVar74._0_4_ + auVar61._0_4_ * 4.7683716e-07;
      auVar101._4_4_ = auVar74._4_4_ + auVar61._4_4_ * 4.7683716e-07;
      auVar101._8_4_ = auVar74._8_4_ + auVar61._8_4_ * 4.7683716e-07;
      auVar101._12_4_ = auVar74._12_4_ + auVar61._12_4_ * 4.7683716e-07;
      uVar5 = vextractps_avx(auVar66,2);
      *(undefined4 *)(uVar53 + 0xc0 + sVar32 * 4) = uVar5;
      *(float *)(uVar53 + 0x60 + sVar32 * 4) = auVar108._0_4_;
      uVar5 = vextractps_avx(auVar108,1);
      *(undefined4 *)(uVar53 + 0xa0 + sVar32 * 4) = uVar5;
      auVar61 = vsubps_avx(auVar62,auVar66);
      uVar5 = vextractps_avx(auVar108,2);
      *(undefined4 *)(uVar53 + 0xe0 + sVar32 * 4) = uVar5;
      *(int *)(uVar53 + 0x100 + sVar32 * 4) = auVar61._0_4_;
      uVar5 = vextractps_avx(auVar61,1);
      *(undefined4 *)(uVar53 + 0x140 + sVar32 * 4) = uVar5;
      auVar62 = vsubps_avx(auVar101,auVar108);
      uVar5 = vextractps_avx(auVar61,2);
      *(undefined4 *)(uVar53 + 0x180 + sVar32 * 4) = uVar5;
      *(int *)(uVar53 + 0x120 + sVar32 * 4) = auVar62._0_4_;
      uVar5 = vextractps_avx(auVar62,1);
      *(undefined4 *)(uVar53 + 0x160 + sVar32 * 4) = uVar5;
      uVar5 = vextractps_avx(auVar62,2);
      *(undefined4 *)(uVar53 + 0x1a0 + sVar32 * 4) = uVar5;
      auVar61 = vcmpss_avx(ZEXT416((uint)fVar4),SUB6416(ZEXT464(0x3f800000),0),0);
      auVar61 = vblendvps_avx(ZEXT416((uint)fVar4),auVar87,auVar61);
      *(float *)(uVar53 + 0x1c0 + sVar32 * 4) = fVar16;
      *(int *)(uVar53 + 0x1e0 + sVar32 * 4) = auVar61._0_4_;
      pfVar37 = pfVar37 + 0x18;
    }
  }
  if ((bVar27 & 1) == 0) {
    (__return_storage_ptr__->ref).ptr = local_1ec8;
    *(tuple<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1ef8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         uStack_1ef0;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 = local_1ee8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         local_1ee8._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1e78._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1e78._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    v1.field_0.i[2] = 0x7f800000;
    v1.field_0.v[0] = 0x7f8000007f800000;
    v1.field_0.i[3] = 0x7f800000;
    local_1ad8.m128[0] = -INFINITY;
    local_1ad8.m128[1] = -INFINITY;
    local_1ad8.m128[2] = -INFINITY;
    local_1ad8.m128[3] = -INFINITY;
    local_1ac8.m128[0] = INFINITY;
    local_1ac8.m128[1] = INFINITY;
    local_1ac8.m128[2] = INFINITY;
    local_1ac8.m128[3] = INFINITY;
    local_1ab8[0].m128[0] = -INFINITY;
    local_1ab8[0].m128[1] = -INFINITY;
    local_1ab8[0].m128[2] = -INFINITY;
    local_1ab8[0].m128[3] = -INFINITY;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      v0.field_0.v[1] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      v0.field_0.v[0] = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&v2,(anon_class_16_2_aeee9775 *)&vSplitPos,(range<unsigned_long> *)&v0)
      ;
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&v0,(context_traits)0x4,CUSTOM_CTX);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::RecalculatePrimRef<embree::QuadMesh>>(embree::avx::RecalculatePrimRef<embree::QuadMesh>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&v2,(d1 *)&right,(blocked_range<unsigned_long> *)&v1,
                 (LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,(anon_class_1_0_00000001 *)&v0,
                 (task_group_context *)local_1ef8._0_8_);
      cVar28 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&v0);
      if (cVar28 != '\0') {
        prVar35 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar35,"task cancelled");
        __cxa_throw(prVar35,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&v0);
    }
    (__return_storage_ptr__->ref).ptr = local_1ec8;
    *(longlong *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = v2.field_0.v[0];
    *(longlong *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         v2.field_0.v[1];
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         CONCAT44(local_1e18.m128[1],local_1e18.m128[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(local_1e18.m128[3],local_1e18.m128[2]);
    *(ulong *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         CONCAT44(local_1e08.i[1],local_1e08.i[0]);
    *(ulong *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1e08.i[3],local_1e08.i[2]);
    local_1eb8._0_8_ = CONCAT44(aaStack_1df8[0].i[1],aaStack_1df8[0].i[0]);
    local_1eb8._8_8_ = CONCAT44(aaStack_1df8[0].i[3],aaStack_1df8[0].i[2]);
    in_00 = local_1e38;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1eb8._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) =
       local_1eb8._8_8_;
  BVar6.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  BVar6.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
  __return_storage_ptr__->dt = BVar6;
  for (uVar53 = 0; uVar53 < children.numChildren; uVar53 = uVar53 + 1) {
    pSVar8 = children.primvecs.items[uVar53];
    psVar1 = &pSVar8->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pvVar36 = pSVar8->prims;
      if (pvVar36 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar32 = pvVar36->size_alloced;
        pPVar9 = pvVar36->items;
        local_1e38 = in_00;
        if (pPVar9 != (PrimRefMB *)0x0) {
          if (sVar32 * 0x50 < 0x1c00000) {
            alignedFree(pPVar9);
          }
          else {
            os_free(pPVar9,sVar32 * 0x50,(pvVar36->alloc).hugepages);
          }
        }
        in_00 = local_1e38;
        if (sVar32 != 0) {
          pMVar10 = (pvVar36->alloc).device;
          (**pMVar10->_vptr_MemoryMonitorInterface)(pMVar10,sVar32 * -0x50,1);
          in_00 = local_1e38;
        }
        pvVar36->size_active = 0;
        pvVar36->size_alloced = 0;
        pvVar36->items = (PrimRefMB *)0x0;
      }
      local_1e38 = in_00;
      ::operator_delete(pvVar36);
      in_00 = local_1e38;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }